

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageTestsUtil.cpp
# Opt level: O3

void __thiscall
vkt::image::Image::Image
          (Image *this,DeviceInterface *vk,VkDevice device,Allocator *allocator,
          VkImageCreateInfo *imageCreateInfo,MemoryRequirement memoryRequirement)

{
  Move<vk::Handle<(vk::HandleType)9>_> *pMVar1;
  VkImage obj;
  Handle<(vk::HandleType)9> HVar2;
  DeviceInterface *pDVar3;
  VkDevice pVVar4;
  VkAllocationCallbacks *pVVar5;
  VkResult result;
  Handle<(vk::HandleType)9> HVar6;
  Move<vk::Handle<(vk::HandleType)9>_> local_78;
  undefined1 local_58 [24];
  VkAllocationCallbacks *pVStack_40;
  
  (this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
  ptr = (Allocation *)0x0;
  pMVar1 = &this->m_image;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  ::vk::createImage(&local_78,vk,device,imageCreateInfo,(VkAllocationCallbacks *)0x0);
  pVVar5 = local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator;
  pVVar4 = local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device;
  pDVar3 = local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface;
  HVar6.m_internal = local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
  ;
  local_58._16_8_ = local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device;
  pVStack_40 = local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator;
  local_58._0_8_ = local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  local_58._8_8_ =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface;
  local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj.m_internal = (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
  if (obj.m_internal == 0) {
    (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device = pVVar4;
    (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
         pVVar5;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
         HVar6.m_internal;
    (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
         pDVar3;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&(this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,obj);
    (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
         (VkDevice)local_58._16_8_;
    (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
         pVStack_40;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
         local_58._0_8_;
    (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_58._8_8_;
    if (local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                (&local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
                 (VkImage)local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                          m_internal);
    }
  }
  ::vk::getImageMemoryRequirements
            ((VkMemoryRequirements *)local_58,vk,device,
             (VkImage)(pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                      m_internal);
  (*allocator->_vptr_Allocator[3])(&local_78,allocator,local_58,(ulong)memoryRequirement.m_flags);
  HVar2.m_internal = local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
  ;
  local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  HVar6.m_internal =
       (deUint64)
       (this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr;
  if (HVar6.m_internal != HVar2.m_internal) {
    if ((Allocation *)HVar6.m_internal == (Allocation *)0x0) {
      (this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr = (Allocation *)HVar2.m_internal;
      HVar6.m_internal = HVar2.m_internal;
    }
    else {
      (*((Allocation *)HVar6.m_internal)->_vptr_Allocation[1])();
      (this->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr = (Allocation *)HVar2.m_internal;
      HVar6.m_internal = HVar2.m_internal;
      if ((long *)local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal !=
          (long *)0x0) {
        (**(code **)(*(long *)local_78.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                              m_internal + 8))();
        HVar6.m_internal =
             (deUint64)
             (this->m_allocation).
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      }
    }
  }
  result = (*vk->_vptr_DeviceInterface[0xd])
                     (vk,device,
                      (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                      m_internal,(((Allocation *)HVar6.m_internal)->m_memory).m_internal,
                      ((Allocation *)HVar6.m_internal)->m_offset);
  ::vk::checkResult(result,
                    "vk.bindImageMemory(device, *m_image, m_allocation->getMemory(), m_allocation->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/image/vktImageTestsUtil.cpp"
                    ,0x37);
  return;
}

Assistant:

Image::Image (const DeviceInterface&	vk,
			  const VkDevice			device,
			  Allocator&				allocator,
			  const VkImageCreateInfo&	imageCreateInfo,
			  const MemoryRequirement	memoryRequirement)
{
	m_image = createImage(vk, device, &imageCreateInfo);
	m_allocation = allocator.allocate(getImageMemoryRequirements(vk, device, *m_image), memoryRequirement);
	VK_CHECK(vk.bindImageMemory(device, *m_image, m_allocation->getMemory(), m_allocation->getOffset()));
}